

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::CIndicesDataTypeUnsignedShort<glcts::(anonymous_namespace)::test_api::GL>::
Run(CIndicesDataTypeUnsignedShort<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  GLsizei GVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  GLuint GVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  short sVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  size_type __n;
  undefined1 auVar14 [16];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  int iVar34;
  int iVar37;
  undefined1 auVar35 [16];
  int iVar38;
  undefined1 auVar36 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar41 [16];
  CColorArray coords;
  vector<unsigned_short,_std::allocator<unsigned_short>_> elements;
  CColorArray bufferTest;
  CColorArray bufferRef2;
  CColorArray bufferRef1;
  DIResult result;
  allocator_type local_559;
  string local_558;
  string local_538;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_518;
  uint local_4fc [3];
  int local_4f0;
  undefined4 local_4ec;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_4e8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_4d0;
  undefined1 local_4b8 [2];
  undefined1 auStack_4b6 [14];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8 [23];
  long local_338;
  DILogger local_328;
  DILogger local_1a8;
  
  local_558._M_string_length = (size_type)local_558._M_dataplus._M_p;
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  local_558._M_dataplus._M_p = (pointer)((long)&local_558 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,0x1aee929);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar8 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_4b8,&local_558,&local_538,true);
  this->_program = GVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if (local_558._M_dataplus._M_p != (pointer)((long)&local_558 + 0x10)) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_4b8 != local_4a8) {
    operator_delete(_local_4b8,local_4a8[0]._M_allocated_capacity + 1);
  }
  if (this->_program == 0) {
    lVar11 = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    local_558._M_dataplus._M_p = (pointer)0x0;
    local_558._M_string_length = 0;
    local_558.field_2._M_allocated_capacity = 0;
    DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,4,8,8,(CColorArray *)&local_558);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,local_558._M_string_length - (long)local_558._M_dataplus._M_p,
               local_558._M_dataplus._M_p,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    __n = (long)(local_558._M_string_length - (long)local_558._M_dataplus._M_p) >> 4;
    iVar34 = (int)__n;
    local_4fc[0] = (uint)(__n >> 1) & 0x7fffffff;
    local_4fc[1] = 1;
    local_4f0 = 3 - iVar34;
    if (iVar34 < 1) {
      local_4f0 = -iVar34;
    }
    local_4f0 = local_4f0 >> 2;
    local_4fc[2] = (uint)(__n >> 2) & 0x3fffffff;
    local_4ec = 0;
    auVar7._14_2_ = 0;
    auVar7._0_14_ = auStack_4b6;
    _local_4b8 = (float  [4])(auVar7 << 0x10);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_538,__n,
               (value_type_conflict3 *)local_4b8,(allocator_type *)&local_4d0);
    auVar7 = _DAT_019ec5b0;
    if (local_538._M_string_length - (long)local_538._M_dataplus._M_p != 0) {
      lVar11 = (long)(local_538._M_string_length - (long)local_538._M_dataplus._M_p) >> 1;
      lVar11 = lVar11 + (ulong)(lVar11 == 0);
      lVar12 = lVar11 + -1;
      auVar14._8_4_ = (int)lVar12;
      auVar14._0_8_ = lVar12;
      auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar13 = 0;
      auVar14 = auVar14 ^ _DAT_019ec5b0;
      auVar16 = _DAT_01a918f0;
      auVar17 = _DAT_01a91900;
      auVar18 = _DAT_01a1c6c0;
      auVar19 = _DAT_019f34d0;
      do {
        auVar20 = auVar19 ^ auVar7;
        iVar34 = auVar14._0_4_;
        iVar33 = -(uint)(iVar34 < auVar20._0_4_);
        iVar9 = auVar14._4_4_;
        auVar21._4_4_ = -(uint)(iVar9 < auVar20._4_4_);
        iVar38 = auVar14._8_4_;
        iVar37 = -(uint)(iVar38 < auVar20._8_4_);
        iVar15 = auVar14._12_4_;
        auVar21._12_4_ = -(uint)(iVar15 < auVar20._12_4_);
        auVar30._4_4_ = iVar33;
        auVar30._0_4_ = iVar33;
        auVar30._8_4_ = iVar37;
        auVar30._12_4_ = iVar37;
        auVar39 = pshuflw(in_XMM11,auVar30,0xe8);
        auVar23._4_4_ = -(uint)(auVar20._4_4_ == iVar9);
        auVar23._12_4_ = -(uint)(auVar20._12_4_ == iVar15);
        auVar23._0_4_ = auVar23._4_4_;
        auVar23._8_4_ = auVar23._12_4_;
        auVar41 = pshuflw(in_XMM12,auVar23,0xe8);
        auVar21._0_4_ = auVar21._4_4_;
        auVar21._8_4_ = auVar21._12_4_;
        auVar40 = pshuflw(auVar39,auVar21,0xe8);
        auVar20._8_4_ = 0xffffffff;
        auVar20._0_8_ = 0xffffffffffffffff;
        auVar20._12_4_ = 0xffffffff;
        auVar20 = (auVar40 | auVar41 & auVar39) ^ auVar20;
        auVar20 = packssdw(auVar20,auVar20);
        sVar10 = (short)uVar13;
        if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)(local_538._M_dataplus._M_p + uVar13 * 2) = sVar10;
        }
        auVar21 = auVar23 & auVar30 | auVar21;
        auVar20 = packssdw(auVar21,auVar21);
        auVar40._8_4_ = 0xffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar40._12_4_ = 0xffffffff;
        auVar20 = packssdw(auVar20 ^ auVar40,auVar20 ^ auVar40);
        if ((auVar20._0_4_ >> 0x10 & 1) != 0) {
          *(short *)(local_538._M_dataplus._M_p + uVar13 * 2 + 2) = sVar10 + 1;
        }
        auVar20 = auVar18 ^ auVar7;
        iVar33 = -(uint)(iVar34 < auVar20._0_4_);
        auVar35._4_4_ = -(uint)(iVar9 < auVar20._4_4_);
        iVar37 = -(uint)(iVar38 < auVar20._8_4_);
        auVar35._12_4_ = -(uint)(iVar15 < auVar20._12_4_);
        auVar22._4_4_ = iVar33;
        auVar22._0_4_ = iVar33;
        auVar22._8_4_ = iVar37;
        auVar22._12_4_ = iVar37;
        auVar29._4_4_ = -(uint)(auVar20._4_4_ == iVar9);
        auVar29._12_4_ = -(uint)(auVar20._12_4_ == iVar15);
        auVar29._0_4_ = auVar29._4_4_;
        auVar29._8_4_ = auVar29._12_4_;
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar20 = auVar29 & auVar22 | auVar35;
        auVar20 = packssdw(auVar20,auVar20);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar20 = packssdw(auVar20 ^ auVar4,auVar20 ^ auVar4);
        if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)(local_538._M_dataplus._M_p + uVar13 * 2 + 4) = sVar10 + 2;
        }
        auVar23 = pshufhw(auVar22,auVar22,0x84);
        auVar30 = pshufhw(auVar29,auVar29,0x84);
        auVar21 = pshufhw(auVar23,auVar35,0x84);
        auVar24._8_4_ = 0xffffffff;
        auVar24._0_8_ = 0xffffffffffffffff;
        auVar24._12_4_ = 0xffffffff;
        auVar24 = (auVar21 | auVar30 & auVar23) ^ auVar24;
        auVar23 = packssdw(auVar24,auVar24);
        if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)(local_538._M_dataplus._M_p + uVar13 * 2 + 6) = sVar10 + 3;
        }
        auVar23 = auVar17 ^ auVar7;
        iVar33 = -(uint)(iVar34 < auVar23._0_4_);
        auVar26._4_4_ = -(uint)(iVar9 < auVar23._4_4_);
        iVar37 = -(uint)(iVar38 < auVar23._8_4_);
        auVar26._12_4_ = -(uint)(iVar15 < auVar23._12_4_);
        auVar31._4_4_ = iVar33;
        auVar31._0_4_ = iVar33;
        auVar31._8_4_ = iVar37;
        auVar31._12_4_ = iVar37;
        auVar20 = pshuflw(auVar20,auVar31,0xe8);
        auVar25._4_4_ = -(uint)(auVar23._4_4_ == iVar9);
        auVar25._12_4_ = -(uint)(auVar23._12_4_ == iVar15);
        auVar25._0_4_ = auVar25._4_4_;
        auVar25._8_4_ = auVar25._12_4_;
        in_XMM12 = pshuflw(auVar41 & auVar39,auVar25,0xe8);
        in_XMM12 = in_XMM12 & auVar20;
        auVar26._0_4_ = auVar26._4_4_;
        auVar26._8_4_ = auVar26._12_4_;
        auVar20 = pshuflw(auVar20,auVar26,0xe8);
        auVar39._8_4_ = 0xffffffff;
        auVar39._0_8_ = 0xffffffffffffffff;
        auVar39._12_4_ = 0xffffffff;
        auVar39 = (auVar20 | in_XMM12) ^ auVar39;
        auVar20 = packssdw(auVar39,auVar39);
        if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)(local_538._M_dataplus._M_p + uVar13 * 2 + 8) = sVar10 + 4;
        }
        auVar26 = auVar25 & auVar31 | auVar26;
        auVar20 = packssdw(auVar26,auVar26);
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar20 = packssdw(auVar20 ^ auVar41,auVar20 ^ auVar41);
        if ((auVar20 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(short *)(local_538._M_dataplus._M_p + uVar13 * 2 + 10) = sVar10 + 5;
        }
        auVar20 = auVar16 ^ auVar7;
        iVar34 = -(uint)(iVar34 < auVar20._0_4_);
        auVar36._4_4_ = -(uint)(iVar9 < auVar20._4_4_);
        iVar38 = -(uint)(iVar38 < auVar20._8_4_);
        auVar36._12_4_ = -(uint)(iVar15 < auVar20._12_4_);
        auVar27._4_4_ = iVar34;
        auVar27._0_4_ = iVar34;
        auVar27._8_4_ = iVar38;
        auVar27._12_4_ = iVar38;
        auVar32._4_4_ = -(uint)(auVar20._4_4_ == iVar9);
        auVar32._12_4_ = -(uint)(auVar20._12_4_ == iVar15);
        auVar32._0_4_ = auVar32._4_4_;
        auVar32._8_4_ = auVar32._12_4_;
        auVar36._0_4_ = auVar36._4_4_;
        auVar36._8_4_ = auVar36._12_4_;
        auVar20 = auVar32 & auVar27 | auVar36;
        auVar20 = packssdw(auVar20,auVar20);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar20 ^ auVar5,auVar20 ^ auVar5);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)(local_538._M_dataplus._M_p + uVar13 * 2 + 0xc) = sVar10 + 6;
        }
        auVar20 = pshufhw(auVar27,auVar27,0x84);
        auVar21 = pshufhw(auVar32,auVar32,0x84);
        auVar23 = pshufhw(auVar20,auVar36,0x84);
        auVar28._8_4_ = 0xffffffff;
        auVar28._0_8_ = 0xffffffffffffffff;
        auVar28._12_4_ = 0xffffffff;
        auVar28 = (auVar23 | auVar21 & auVar20) ^ auVar28;
        auVar20 = packssdw(auVar28,auVar28);
        if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)(local_538._M_dataplus._M_p + uVar13 * 2 + 0xe) = sVar10 + 7;
        }
        uVar13 = uVar13 + 8;
        lVar12 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 8;
        auVar19._8_8_ = lVar12 + 8;
        lVar12 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 8;
        auVar18._8_8_ = lVar12 + 8;
        lVar12 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 8;
        auVar17._8_8_ = lVar12 + 8;
        lVar12 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 8;
        auVar16._8_8_ = lVar12 + 8;
      } while ((lVar11 + 7U & 0xfffffffffffffff8) != uVar13);
    }
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glBufferSubData(this_00,0x8f3f,0,0x14,local_4fc);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8893,local_538._M_string_length - (long)local_538._M_dataplus._M_p,
               local_538._M_dataplus._M_p,0x88e4);
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1403,(void *)0x0);
    iVar34 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    iVar34 = *(int *)CONCAT44(extraout_var,iVar34);
    iVar9 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    _local_4b8 = 0.0;
    auStack_4b6._2_4_ = 0.0;
    auStack_4b6._6_4_ = 0.0;
    auStack_4b6._10_4_ = 0.0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_4d0,(long)((iVar34 * *(int *)(CONCAT44(extraout_var_00,iVar9) + 4)) / 2),
               (value_type *)local_4b8,(allocator_type *)&local_4e8);
    iVar34 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    iVar34 = *(int *)CONCAT44(extraout_var_01,iVar34);
    iVar9 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    auStack_4b6._6_4_ = 0.3;
    auStack_4b6._10_4_ = 1.0;
    _local_4b8 = 0.1;
    auStack_4b6._2_4_ = 0.2;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_4e8,(long)((iVar34 * *(int *)(CONCAT44(extraout_var_02,iVar9) + 4)) / 2),
               (value_type *)local_4b8,(allocator_type *)&local_518);
    iVar34 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    iVar34 = *(int *)CONCAT44(extraout_var_03,iVar34);
    iVar9 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    _local_4b8 = 0.0;
    auStack_4b6._2_4_ = 0.0;
    auStack_4b6._6_4_ = 0.0;
    auStack_4b6._10_4_ = 0.0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_518,(long)(iVar34 * *(int *)(CONCAT44(extraout_var_04,iVar9) + 4)),
               (value_type *)local_4b8,&local_559);
    auVar6[0xf] = 0;
    auVar6._0_15_ = stack0xfffffffffffffb49;
    _local_4b8 = (float  [4])(auVar6 << 8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(auStack_4b6 + 6));
    local_338 = 0;
    iVar34 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    GVar1 = *(GLsizei *)CONCAT44(extraout_var_05,iVar34);
    iVar34 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,GVar1,*(int *)(CONCAT44(extraout_var_06,iVar34) + 4) / 2,0x1908,0x1406,
               local_518.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar34 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    uVar2 = *(uint *)CONCAT44(extraout_var_07,iVar34);
    iVar34 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    iVar34 = *(int *)(CONCAT44(extraout_var_08,iVar34) + 4);
    iVar9 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar3 = *(uint *)CONCAT44(extraout_var_09,iVar9);
    iVar9 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar11 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                       ((DrawIndirectBase *)
                        ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)
                        ->m_renderCtx,&local_518,uVar2,iVar34 / 2,&local_4e8,uVar3,
                        *(int *)(CONCAT44(extraout_var_10,iVar9) + 4) / 2);
    DIResult::sub_result(&local_1a8,(DIResult *)local_4b8,lVar11);
    DILogger::~DILogger(&local_1a8);
    iVar34 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    iVar34 = *(int *)(CONCAT44(extraout_var_11,iVar34) + 4);
    iVar9 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    GVar1 = *(GLsizei *)CONCAT44(extraout_var_12,iVar9);
    iVar9 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (this_00,0,(iVar34 - (iVar34 + 1 >> 0x1f)) + 1 >> 1,GVar1,
               *(int *)(CONCAT44(extraout_var_13,iVar9) + 4) / 2,0x1908,0x1406,
               local_518.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar34 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    uVar2 = *(uint *)CONCAT44(extraout_var_14,iVar34);
    iVar34 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    iVar34 = *(int *)(CONCAT44(extraout_var_15,iVar34) + 4);
    iVar9 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar3 = *(uint *)CONCAT44(extraout_var_16,iVar9);
    iVar9 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar11 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                       ((DrawIndirectBase *)
                        ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)
                        ->m_renderCtx,&local_518,uVar2,iVar34 / 2,&local_4d0,uVar3,
                        *(int *)(CONCAT44(extraout_var_17,iVar9) + 4) / 2);
    DIResult::sub_result(&local_328,(DIResult *)local_4b8,lVar11);
    DILogger::~DILogger(&local_328);
    lVar11 = local_338;
    DILogger::~DILogger((DILogger *)local_4b8);
    if (local_518.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_518.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_518.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_518.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4e8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4e8.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4e8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4e8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4d0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4d0.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4d0.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_538._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_538._M_dataplus._M_p,
                      local_538.field_2._M_allocated_capacity - (long)local_538._M_dataplus._M_p);
    }
    if (local_558._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_558._M_dataplus._M_p,
                      local_558.field_2._M_allocated_capacity - (long)local_558._M_dataplus._M_p);
    }
  }
  return lVar11;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		indirectElements.count						 = static_cast<GLuint>(coords.size()) / 2;
		indirectElements.primCount					 = 1;
		indirectElements.baseVertex					 = -static_cast<GLint>(coords.size()) / 4;
		indirectElements.firstIndex					 = static_cast<GLuint>(coords.size()) / 4;
		indirectElements.reservedMustBeZero			 = 0;

		std::vector<GLushort> elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLushort>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_DRAW_INDIRECT_BUFFER, 0, sizeof(DrawElementsIndirectCommand), &indirectElements);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_SHORT, 0);

		CColorArray bufferRef1(getWindowWidth() * getWindowHeight() / 2, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		CColorArray bufferRef2(getWindowWidth() * getWindowHeight() / 2, tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight() / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight() / 2, bufferRef2,
										 getWindowWidth(), getWindowHeight() / 2));

		ReadPixelsFloat<api>(0, (getWindowHeight() + 1) / 2, getWindowWidth(), getWindowHeight() / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight() / 2, bufferRef1,
										 getWindowWidth(), getWindowHeight() / 2));

		return result.code();
	}